

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_strmatch_fuzzy_text(char *str,int str_len,char *pattern,int *out_score)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool local_95;
  bool local_8d;
  int local_7c;
  int penalty;
  int count;
  int new_score;
  int pattern_repeat;
  int advanced;
  int rematch;
  int next_match;
  char str_letter;
  char pattern_letter;
  char *pcStack_58;
  int best_letter_score;
  char *best_letter;
  int prev_separator;
  int prev_lower;
  int prev_matched;
  int str_iter;
  char *pattern_iter;
  int score;
  int *out_score_local;
  char *pattern_local;
  int str_len_local;
  char *str_local;
  
  pattern_iter._4_4_ = 0;
  prev_lower = 0;
  bVar3 = false;
  bVar10 = false;
  local_95 = true;
  pcStack_58 = (char *)0x0;
  next_match = 0;
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x1a0a,"int nk_strmatch_fuzzy_text(const char *, int, const char *, int *)");
  }
  if (pattern != (char *)0x0) {
    if (((str == (char *)0x0) || (str_len == 0)) ||
       (_prev_matched = pattern, pattern == (char *)0x0)) {
      str_local._4_4_ = 0;
    }
    else {
      for (; prev_lower < str_len; prev_lower = prev_lower + 1) {
        cVar1 = *_prev_matched;
        cVar2 = str[prev_lower];
        bVar6 = false;
        if (*_prev_matched != '\0') {
          iVar4 = nk_to_lower((int)cVar1);
          iVar5 = nk_to_lower((int)cVar2);
          bVar6 = iVar4 == iVar5;
        }
        bVar7 = false;
        if (pcStack_58 != (char *)0x0) {
          iVar4 = nk_to_upper((int)*pcStack_58);
          iVar5 = nk_to_upper((int)cVar2);
          bVar7 = iVar4 == iVar5;
        }
        local_8d = bVar6 && pcStack_58 != (char *)0x0;
        bVar8 = false;
        if (pcStack_58 != (char *)0x0) {
          bVar8 = *_prev_matched != '\0';
        }
        bVar9 = false;
        if (bVar8) {
          iVar4 = nk_to_lower((int)*pcStack_58);
          iVar5 = nk_to_lower((int)cVar1);
          bVar9 = iVar4 == iVar5;
        }
        if ((local_8d) || (bVar9)) {
          pattern_iter._4_4_ = next_match + pattern_iter._4_4_;
          pcStack_58 = (char *)0x0;
          next_match = 0;
        }
        if ((bVar6) || (bVar7)) {
          penalty = 0;
          if (_prev_matched == pattern) {
            local_7c = prev_lower * -3;
            if (local_7c < -9) {
              local_7c = -9;
            }
            pattern_iter._4_4_ = local_7c + pattern_iter._4_4_;
          }
          if (bVar3) {
            penalty = 5;
          }
          if (local_95) {
            penalty = penalty + 10;
          }
          if ((bVar10) && (iVar4 = nk_is_upper((int)cVar2), iVar4 != 0)) {
            penalty = penalty + 10;
          }
          if (bVar6) {
            _prev_matched = _prev_matched + 1;
          }
          if ((uint)next_match <= (uint)penalty) {
            if (pcStack_58 != (char *)0x0) {
              pattern_iter._4_4_ = pattern_iter._4_4_ + -1;
            }
            pcStack_58 = str + prev_lower;
            next_match = penalty;
          }
          bVar3 = true;
        }
        else {
          pattern_iter._4_4_ = pattern_iter._4_4_ + -1;
          bVar3 = false;
        }
        iVar4 = nk_is_lower((int)cVar2);
        bVar10 = iVar4 != 0;
        local_95 = cVar2 == '_' || cVar2 == ' ';
      }
      if (pcStack_58 != (char *)0x0) {
        pattern_iter._4_4_ = next_match + pattern_iter._4_4_;
      }
      if (*_prev_matched == '\0') {
        if (out_score != (int *)0x0) {
          *out_score = pattern_iter._4_4_;
        }
        str_local._4_4_ = 1;
      }
      else {
        str_local._4_4_ = 0;
      }
    }
    return str_local._4_4_;
  }
  __assert_fail("pattern",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x1a0b,"int nk_strmatch_fuzzy_text(const char *, int, const char *, int *)");
}

Assistant:

NK_API int
nk_strmatch_fuzzy_text(const char *str, int str_len,
    const char *pattern, int *out_score)
{
    /* Returns true if each character in pattern is found sequentially within str
     * if found then out_score is also set. Score value has no intrinsic meaning.
     * Range varies with pattern. Can only compare scores with same search pattern. */

    /* bonus for adjacent matches */
    #define NK_ADJACENCY_BONUS 5
    /* bonus if match occurs after a separator */
    #define NK_SEPARATOR_BONUS 10
    /* bonus if match is uppercase and prev is lower */
    #define NK_CAMEL_BONUS 10
    /* penalty applied for every letter in str before the first match */
    #define NK_LEADING_LETTER_PENALTY (-3)
    /* maximum penalty for leading letters */
    #define NK_MAX_LEADING_LETTER_PENALTY (-9)
    /* penalty for every letter that doesn't matter */
    #define NK_UNMATCHED_LETTER_PENALTY (-1)

    /* loop variables */
    int score = 0;
    char const * pattern_iter = pattern;
    int str_iter = 0;
    int prev_matched = nk_false;
    int prev_lower = nk_false;
    /* true so if first letter match gets separator bonus*/
    int prev_separator = nk_true;

    /* use "best" matched letter if multiple string letters match the pattern */
    char const * best_letter = 0;
    int best_letter_score = 0;

    /* loop over strings */
    NK_ASSERT(str);
    NK_ASSERT(pattern);
    if (!str || !str_len || !pattern) return 0;
    while (str_iter < str_len)
    {
        const char pattern_letter = *pattern_iter;
        const char str_letter = str[str_iter];

        int next_match = *pattern_iter != '\0' &&
            nk_to_lower(pattern_letter) == nk_to_lower(str_letter);
        int rematch = best_letter && nk_to_upper(*best_letter) == nk_to_upper(str_letter);

        int advanced = next_match && best_letter;
        int pattern_repeat = best_letter && *pattern_iter != '\0';
        pattern_repeat = pattern_repeat &&
            nk_to_lower(*best_letter) == nk_to_lower(pattern_letter);

        if (advanced || pattern_repeat) {
            score += best_letter_score;
            best_letter = 0;
            best_letter_score = 0;
        }

        if (next_match || rematch)
        {
            int new_score = 0;
            /* Apply penalty for each letter before the first pattern match */
            if (pattern_iter == pattern) {
                int count = (int)(&str[str_iter] - str);
                int penalty = NK_LEADING_LETTER_PENALTY * count;
                if (penalty < NK_MAX_LEADING_LETTER_PENALTY)
                    penalty = NK_MAX_LEADING_LETTER_PENALTY;

                score += penalty;
            }

            /* apply bonus for consecutive bonuses */
            if (prev_matched)
                new_score += NK_ADJACENCY_BONUS;

            /* apply bonus for matches after a separator */
            if (prev_separator)
                new_score += NK_SEPARATOR_BONUS;

            /* apply bonus across camel case boundaries */
            if (prev_lower && nk_is_upper(str_letter))
                new_score += NK_CAMEL_BONUS;

            /* update pattern iter IFF the next pattern letter was matched */
            if (next_match)
                ++pattern_iter;

            /* update best letter in str which may be for a "next" letter or a rematch */
            if (new_score >= best_letter_score) {
                /* apply penalty for now skipped letter */
                if (best_letter != 0)
                    score += NK_UNMATCHED_LETTER_PENALTY;

                best_letter = &str[str_iter];
                best_letter_score = new_score;
            }
            prev_matched = nk_true;
        } else {
            score += NK_UNMATCHED_LETTER_PENALTY;
            prev_matched = nk_false;
        }

        /* separators should be more easily defined */
        prev_lower = nk_is_lower(str_letter) != 0;
        prev_separator = str_letter == '_' || str_letter == ' ';

        ++str_iter;
    }

    /* apply score for last match */
    if (best_letter)
        score += best_letter_score;

    /* did not match full pattern */
    if (*pattern_iter != '\0')
        return nk_false;

    if (out_score)
        *out_score = score;
    return nk_true;
}